

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O2

void duckdb::TemplatedRadixScatter<long>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  ulong *puVar5;
  bool bVar6;
  long lVar7;
  idx_t iVar8;
  idx_t i;
  idx_t iVar9;
  undefined3 in_register_00000089;
  
  pdVar1 = vdata->data;
  if (CONCAT31(in_register_00000089,has_null) == 0) {
    for (iVar9 = 0; iVar9 != add_count; iVar9 = iVar9 + 1) {
      iVar8 = iVar9;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)sel->sel_vector[iVar9];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar8];
      }
      puVar5 = (ulong *)key_locations[iVar9];
      uVar4 = *(ulong *)(pdVar1 + iVar8 * 8 + offset * 8);
      *puVar5 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
                uVar4 << 0x38;
      *(data_t *)puVar5 = (char)(uVar4 >> 0x38) + 0x80;
      if (desc) {
        for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
          key_locations[iVar9][lVar7] = ~key_locations[iVar9][lVar7];
        }
      }
      key_locations[iVar9] = key_locations[iVar9] + 8;
    }
  }
  else {
    for (iVar9 = 0; iVar9 != add_count; iVar9 = iVar9 + 1) {
      iVar8 = iVar9;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)sel->sel_vector[iVar9];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar8 = (idx_t)psVar2[iVar8];
      }
      bVar6 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,
                         iVar8 + offset);
      if (bVar6) {
        *key_locations[iVar9] = nulls_first;
        pdVar3 = key_locations[iVar9];
        uVar4 = *(ulong *)(pdVar1 + (iVar8 + offset) * 8);
        *(ulong *)(pdVar3 + 1) =
             uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
             (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
             (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
        pdVar3[1] = (char)(uVar4 >> 0x38) + 0x80;
        if (desc) {
          for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
            key_locations[iVar9][lVar7 + 1] = ~key_locations[iVar9][lVar7 + 1];
          }
        }
      }
      else {
        *key_locations[iVar9] = !nulls_first;
        pdVar3 = key_locations[iVar9];
        pdVar3[1] = '\0';
        pdVar3[2] = '\0';
        pdVar3[3] = '\0';
        pdVar3[4] = '\0';
        pdVar3[5] = '\0';
        pdVar3[6] = '\0';
        pdVar3[7] = '\0';
        pdVar3[8] = '\0';
      }
      key_locations[iVar9] = key_locations[iVar9] + 9;
    }
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}